

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

SrcList * sqlite3SrcListAppend(sqlite3 *db,SrcList *pList,Token *pTable,Token *pDatabase)

{
  short sVar1;
  SrcList *pList_00;
  char *pcVar2;
  Token *pName;
  
  if (pList == (SrcList *)0x0) {
    pList = (SrcList *)sqlite3DbMallocZero(db,0x70);
    if (pList == (SrcList *)0x0) {
      return (SrcList *)0x0;
    }
    pList->nAlloc = 1;
  }
  pList_00 = sqlite3SrcListEnlarge(db,pList,1,(int)pList->nSrc);
  if (db->mallocFailed != '\0') {
    sqlite3SrcListDelete(db,pList_00);
    return (SrcList *)0x0;
  }
  sVar1 = pList_00->nSrc;
  if (pDatabase == (Token *)0x0) {
    pDatabase = (Token *)0x0;
  }
  else if (pDatabase->z == (char *)0x0) {
    pDatabase = (Token *)0x0;
  }
  pName = pTable;
  if (pDatabase == (Token *)0x0) {
    pName = (Token *)0x0;
    pDatabase = pTable;
  }
  pcVar2 = sqlite3NameFromToken(db,pDatabase);
  pList_00->a[(long)sVar1 + -1].zName = pcVar2;
  pcVar2 = sqlite3NameFromToken(db,pName);
  pList_00->a[(long)sVar1 + -1].zDatabase = pcVar2;
  return pList_00;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppend(
  sqlite3 *db,        /* Connection to notify of malloc failures */
  SrcList *pList,     /* Append to this SrcList. NULL creates a new SrcList */
  Token *pTable,      /* Table to append */
  Token *pDatabase    /* Database of the table */
){
  struct SrcList_item *pItem;
  assert( pDatabase==0 || pTable!=0 );  /* Cannot have C without B */
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(SrcList) );
    if( pList==0 ) return 0;
    pList->nAlloc = 1;
  }
  pList = sqlite3SrcListEnlarge(db, pList, 1, pList->nSrc);
  if( db->mallocFailed ){
    sqlite3SrcListDelete(db, pList);
    return 0;
  }
  pItem = &pList->a[pList->nSrc-1];
  if( pDatabase && pDatabase->z==0 ){
    pDatabase = 0;
  }
  if( pDatabase ){
    Token *pTemp = pDatabase;
    pDatabase = pTable;
    pTable = pTemp;
  }
  pItem->zName = sqlite3NameFromToken(db, pTable);
  pItem->zDatabase = sqlite3NameFromToken(db, pDatabase);
  return pList;
}